

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_wrapper.hpp
# Opt level: O0

PyObject *
boost::python::objects::
class_cref_wrapper<GlobalStimulationCommand,_boost::python::objects::make_instance<GlobalStimulationCommand,_boost::python::objects::value_holder<GlobalStimulationCommand>_>_>
::convert(GlobalStimulationCommand *x)

{
  PyObject *pPVar1;
  GlobalStimulationCommand *in_RDI;
  reference_wrapper<const_GlobalStimulationCommand> *in_stack_00000008;
  undefined1 local_18 [16];
  undefined1 *local_8;
  
  local_8 = local_18;
  addressof<GlobalStimulationCommand_const>(in_RDI);
  pPVar1 = make_instance_impl<GlobalStimulationCommand,boost::python::objects::value_holder<GlobalStimulationCommand>,boost::python::objects::make_instance<GlobalStimulationCommand,boost::python::objects::value_holder<GlobalStimulationCommand>>>
           ::execute<boost::reference_wrapper<GlobalStimulationCommand_const>const>
                     (in_stack_00000008);
  return pPVar1;
}

Assistant:

static PyObject* convert(Src const& x)
    {
        return MakeInstance::execute(boost::ref(x));
    }